

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_3b8fd3::QDynamicBufferResourceRoot::registerSelf
          (QDynamicBufferResourceRoot *this,uchar *b,qsizetype size)

{
  int v;
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RDX;
  uchar *in_RSI;
  QResourceRoot *in_RDI;
  quint32 acceptableFlags;
  quint32 file_flags;
  int name_offset;
  int data_offset;
  int tree_offset;
  int version;
  int offset;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_38;
  bool local_1;
  
  if ((in_RDX < 0) || (0x13 < in_RDX)) {
    if ((*in_RSI == 'q') && (((in_RSI[1] == 'r' && (in_RSI[2] == 'e')) && (in_RSI[3] == 's')))) {
      v = qFromBigEndian<int>((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
      ;
      iVar1 = qFromBigEndian<int>((void *)CONCAT44(in_stack_ffffffffffffffc4,
                                                   in_stack_ffffffffffffffc0));
      iVar2 = qFromBigEndian<int>((void *)CONCAT44(in_stack_ffffffffffffffc4,
                                                   in_stack_ffffffffffffffc0));
      iVar3 = qFromBigEndian<int>((void *)CONCAT44(in_stack_ffffffffffffffc4,
                                                   in_stack_ffffffffffffffc0));
      local_38 = 0;
      if (2 < v) {
        local_38 = qFromBigEndian<int>((void *)CONCAT44(in_stack_ffffffffffffffc4,
                                                        in_stack_ffffffffffffffc0));
      }
      if ((in_RDX < 0) || (((iVar1 < in_RDX && (iVar2 < in_RDX)) && (iVar3 < in_RDX)))) {
        if ((local_38 & 0xfffffffa) == 0) {
          if ((v < 1) || (3 < v)) {
            local_1 = false;
          }
          else {
            in_RDI[1].payloads = in_RSI;
            QResourceRoot::setSource(in_RDI,v,in_RSI + iVar1,in_RSI + iVar3,in_RSI + iVar2);
            local_1 = true;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool registerSelf(const uchar *b, qsizetype size)
    {
        // 5 int "pointers"
        if (size >= 0 && size < 20)
            return false;

        // setup the data now
        int offset = 0;

        // magic number
        if (b[offset + 0] != 'q' || b[offset + 1] != 'r' || b[offset + 2] != 'e'
            || b[offset + 3] != 's') {
            return false;
        }
        offset += 4;

        const int version = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int tree_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int data_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int name_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        quint32 file_flags = 0;
        if (version >= 3) {
            file_flags = qFromBigEndian<qint32>(b + offset);
            offset += 4;
        }

        // Some sanity checking for sizes. This is _not_ a security measure.
        if (size >= 0 && (tree_offset >= size || data_offset >= size || name_offset >= size))
            return false;

        // And some sanity checking for features
        quint32 acceptableFlags = 0;
#ifndef QT_NO_COMPRESS
        acceptableFlags |= Compressed;
#endif
        if (QT_CONFIG(zstd))
            acceptableFlags |= CompressedZstd;
        if (file_flags & ~acceptableFlags)
            return false;

        if (version >= 0x01 && version <= 0x03) {
            buffer = b;
            setSource(version, b + tree_offset, b + name_offset, b + data_offset);
            return true;
        }
        return false;
    }